

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void libcellml::flattenComponentImports
               (ComponentEntityPtr *parent,ComponentPtr *component,size_t componentIndex)

{
  size_t sVar1;
  ulong componentIndex_00;
  ComponentPtr flattenedComponent;
  ComponentPtr c;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  ComponentEntity local_40;
  
  flattenComponent((ComponentEntityPtr *)&local_60,(ComponentPtr *)parent,(size_t)component);
  componentIndex_00 = 0;
  while( true ) {
    sVar1 = ComponentEntity::componentCount(&(local_60._M_ptr)->super_ComponentEntity);
    if (sVar1 <= componentIndex_00) break;
    ComponentEntity::component(&local_40,(size_t)local_60._M_ptr);
    std::__shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>(local_50,&local_60);
    flattenComponentImports
              ((ComponentEntityPtr *)local_50,(ComponentPtr *)&local_40,componentIndex_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    componentIndex_00 = componentIndex_00 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return;
}

Assistant:

void flattenComponentImports(const ComponentEntityPtr &parent, ComponentPtr &component, size_t componentIndex)
{
    auto flattenedComponent = flattenComponent(parent, component, componentIndex);
    for (size_t index = 0; index < flattenedComponent->componentCount(); ++index) {
        auto c = flattenedComponent->component(index);
        flattenComponentImports(flattenedComponent, c, index);
    }
}